

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  Token *this_01;
  int iVar1;
  TransformNode *this_02;
  mapped_type *child_00;
  runtime_error *this_03;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *in_RDX;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  size_t child;
  AffineSpace3fa space;
  string local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  undefined1 local_a8 [16];
  key_type local_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  
  this_00 = (XML *)*in_RDX;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"child","");
  XML::parm((string *)&local_88.field_1,this_00,&local_f8);
  iVar1 = atoi((char *)local_88._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  this_01 = *(Token **)(*in_RDX + 0x98);
  local_90 = (long)iVar1;
  if (*(long *)(*in_RDX + 0xa0) - (long)this_01 == 0x360) {
    local_a8._0_4_ = Token::Float(this_01,true);
    local_a8._4_4_ = extraout_XMM0_Db;
    local_a8._8_4_ = extraout_XMM0_Dc;
    local_a8._12_4_ = extraout_XMM0_Dd;
    local_c8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    local_c8._4_4_ = extraout_XMM0_Db_00;
    local_c8._8_4_ = extraout_XMM0_Dc_00;
    local_c8._12_4_ = extraout_XMM0_Dd_00;
    fVar4 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    local_a8._4_4_ = local_c8._0_4_;
    local_a8._8_4_ = fVar4;
    local_a8._12_4_ = 0;
    local_c8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0xd8),true);
    local_c8._4_4_ = extraout_XMM0_Db_01;
    local_c8._8_4_ = extraout_XMM0_Dc_01;
    local_c8._12_4_ = extraout_XMM0_Dd_01;
    local_d8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x120),true);
    local_d8._4_4_ = extraout_XMM0_Db_02;
    local_d8._8_4_ = extraout_XMM0_Dc_02;
    local_d8._12_4_ = extraout_XMM0_Dd_02;
    fVar4 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x168),true);
    local_c8._4_4_ = local_d8._0_4_;
    local_c8._8_4_ = fVar4;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x1b0),true);
    local_d8._4_4_ = extraout_XMM0_Db_03;
    local_d8._8_4_ = extraout_XMM0_Dc_03;
    local_d8._12_4_ = extraout_XMM0_Dd_03;
    local_b8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x1f8),true);
    fVar4 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x240),true);
    local_d8._4_4_ = local_b8;
    local_d8._8_4_ = fVar4;
    local_d8._12_4_ = 0;
    local_b8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x288),true);
    local_48 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x2d0),true);
    fVar4 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x318),true);
    local_88._0_8_ = local_a8._0_8_;
    local_88._8_8_ = local_a8._8_8_;
    local_78._M_allocated_capacity = local_c8._0_8_;
    local_78._8_8_ = local_c8._8_8_;
    local_68 = local_d8._0_8_;
    uStack_60 = local_d8._8_8_;
    local_58._4_4_ = local_48;
    local_58._0_4_ = local_b8;
    local_58._8_4_ = fVar4;
    local_58._12_4_ = 0;
    this_02 = (TransformNode *)alignedMalloc(0xa0,0x10);
    child_00 = std::
               map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     *)(xml + 0xc),&local_90);
    SceneGraph::TransformNode::TransformNode(this_02,(AffineSpace3fa *)&local_88.field_1,child_00);
    (this->path).filename._M_dataplus._M_p = (pointer)this_02;
    (**(code **)((long)(this_02->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_02);
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_f8,(ParseLocation *)(*in_RDX + 0x10));
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_88._0_8_ = *plVar2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ == paVar3) {
    local_78._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_78._8_8_ = plVar2[3];
    local_88._0_8_ = &local_78;
  }
  else {
    local_78._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_88._8_8_ = plVar2[1];
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_03,(string *)&local_88.field_1);
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFTransformNode(const Ref<XML>& xml) 
  {
    const size_t child = atoi(xml->parm("child").c_str()); 
    if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
    const AffineSpace3fa space(LinearSpace3fa(Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float()),
                                              Vec3fa(xml->body[3].Float(),xml->body[4].Float(),xml->body[5].Float()),
                                              Vec3fa(xml->body[6].Float(),xml->body[7].Float(),xml->body[8].Float())),
                               Vec3fa(xml->body[9].Float(),xml->body[10].Float(),xml->body[11].Float()));
    return new SceneGraph::TransformNode(space,id2node.at(child));
  }